

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O0

int __thiscall
TPZDohrMatrix<double,_TPZDohrSubstruct<double>_>::ClassId
          (TPZDohrMatrix<double,_TPZDohrSubstruct<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *str;
  allocator<char> *in_stack_fffffffffffff450;
  char *in_stack_fffffffffffff458;
  TPZDohrSubstruct<double> *in_stack_fffffffffffff460;
  TPZMatrix<double> *in_stack_fffffffffffff470;
  TPZDohrSubstruct<double> *in_stack_fffffffffffff500;
  undefined1 local_29 [41];
  
  str = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff460,in_stack_fffffffffffff458,in_stack_fffffffffffff450);
  uVar1 = Hash(str);
  iVar2 = TPZMatrix<double>::ClassId(in_stack_fffffffffffff470);
  TPZDohrSubstruct<double>::TPZDohrSubstruct(in_stack_fffffffffffff500);
  iVar3 = TPZDohrSubstruct<double>::ClassId(in_stack_fffffffffffff460);
  TPZDohrSubstruct<double>::~TPZDohrSubstruct((TPZDohrSubstruct<double> *)0x1fd1c73);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZDohrMatrix<TVar, TSubStruct>::ClassId() const{
    return Hash("TPZDohrMatrix") ^ TPZMatrix<TVar>::ClassId() << 1 ^ TSubStruct().ClassId() << 2;
}